

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cc
# Opt level: O0

int yy_get_next_buffer(void)

{
  YY_BUFFER_STATE pyVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int *piVar5;
  size_t sVar6;
  char *pcVar7;
  bool bVar8;
  int local_48;
  int new_size_1;
  int n;
  int c;
  int new_size;
  int yy_c_buf_p_offset;
  YY_BUFFER_STATE b;
  int num_to_read;
  int ret_val;
  int i;
  int number_to_move;
  char *source;
  char *dest;
  
  source = yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf;
  _i = yytext;
  if (yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf + (yy_n_chars + 1) < yy_c_buf_p) {
    my_fatal_error("fatal flex scanner internal error--end of buffer missed");
  }
  if (yy_buffer_stack[yy_buffer_stack_top]->yy_fill_buffer == 0) {
    if ((long)yy_c_buf_p - (long)yytext == 1) {
      dest._4_4_ = 1;
    }
    else {
      dest._4_4_ = 2;
    }
  }
  else {
    iVar2 = ((int)yy_c_buf_p - (int)yytext) + -1;
    for (num_to_read = 0; num_to_read < iVar2; num_to_read = num_to_read + 1) {
      *source = *_i;
      _i = _i + 1;
      source = source + 1;
    }
    if (yy_buffer_stack[yy_buffer_stack_top]->yy_buffer_status == 2) {
      yy_n_chars = 0;
      yy_buffer_stack[yy_buffer_stack_top]->yy_n_chars = 0;
    }
    else {
      iVar3 = yy_buffer_stack[yy_buffer_stack_top]->yy_buf_size - iVar2;
      while (b._0_4_ = iVar3 + -1, (int)b < 1) {
        pyVar1 = yy_buffer_stack[yy_buffer_stack_top];
        pcVar7 = pyVar1->yy_ch_buf;
        iVar3 = (int)yy_c_buf_p;
        if (pyVar1->yy_is_our_buffer == 0) {
          pyVar1->yy_ch_buf = (char *)0x0;
        }
        else {
          if (pyVar1->yy_buf_size << 1 < 1) {
            pyVar1->yy_buf_size = pyVar1->yy_buf_size / 8 + pyVar1->yy_buf_size;
          }
          else {
            pyVar1->yy_buf_size = pyVar1->yy_buf_size << 1;
          }
          pcVar4 = (char *)yyrealloc(pyVar1->yy_ch_buf,(long)(pyVar1->yy_buf_size + 2));
          pyVar1->yy_ch_buf = pcVar4;
        }
        if (pyVar1->yy_ch_buf == (char *)0x0) {
          my_fatal_error("fatal error - scanner input buffer overflow");
        }
        yy_c_buf_p = pyVar1->yy_ch_buf + (iVar3 - (int)pcVar7);
        iVar3 = yy_buffer_stack[yy_buffer_stack_top]->yy_buf_size - iVar2;
      }
      if (0x2000 < (int)b) {
        b._0_4_ = 0x2000;
      }
      if (yy_buffer_stack[yy_buffer_stack_top]->yy_is_interactive == 0) {
        piVar5 = __errno_location();
        *piVar5 = 0;
        while( true ) {
          sVar6 = fread(yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf + iVar2,1,(long)(int)b,
                        (FILE *)yyin);
          yy_n_chars = (int)sVar6;
          bVar8 = false;
          if (yy_n_chars == 0) {
            iVar3 = ferror((FILE *)yyin);
            bVar8 = iVar3 != 0;
          }
          if (!bVar8) goto LAB_0014792a;
          piVar5 = __errno_location();
          if (*piVar5 != 4) break;
          piVar5 = __errno_location();
          *piVar5 = 0;
          clearerr((FILE *)yyin);
        }
        my_fatal_error("input in flex scanner failed");
      }
      else {
        new_size_1 = 0x2a;
        local_48 = 0;
        while( true ) {
          bVar8 = false;
          if (local_48 < (int)b) {
            new_size_1 = getc((FILE *)yyin);
            bVar8 = false;
            if (new_size_1 != -1) {
              bVar8 = new_size_1 != 10;
            }
          }
          if (!bVar8) break;
          yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf[(long)local_48 + (long)iVar2] =
               (char)new_size_1;
          local_48 = local_48 + 1;
        }
        if (new_size_1 == 10) {
          yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf[(long)local_48 + (long)iVar2] =
               (char)new_size_1;
          local_48 = local_48 + 1;
        }
        if ((new_size_1 == -1) && (iVar3 = ferror((FILE *)yyin), iVar3 != 0)) {
          my_fatal_error("input in flex scanner failed");
        }
        yy_n_chars = local_48;
      }
LAB_0014792a:
      yy_buffer_stack[yy_buffer_stack_top]->yy_n_chars = yy_n_chars;
    }
    if (yy_n_chars == 0) {
      if (iVar2 == 0) {
        b._4_4_ = 1;
        yyrestart(yyin);
      }
      else {
        b._4_4_ = 2;
        yy_buffer_stack[yy_buffer_stack_top]->yy_buffer_status = 2;
      }
    }
    else {
      b._4_4_ = 0;
    }
    if (yy_buffer_stack[yy_buffer_stack_top]->yy_buf_size < yy_n_chars + iVar2) {
      iVar3 = yy_n_chars + iVar2 + (yy_n_chars >> 1);
      pcVar7 = (char *)yyrealloc(yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf,(long)iVar3);
      yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf = pcVar7;
      if (yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf == (char *)0x0) {
        my_fatal_error("out of dynamic memory in yy_get_next_buffer()");
      }
      yy_buffer_stack[yy_buffer_stack_top]->yy_buf_size = iVar3 + -2;
    }
    yy_n_chars = iVar2 + yy_n_chars;
    yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf[yy_n_chars] = '\0';
    yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf[yy_n_chars + 1] = '\0';
    yytext = yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf;
    dest._4_4_ = b._4_4_;
  }
  return dest._4_4_;
}

Assistant:

static int yy_get_next_buffer (void)
{
    	char *dest = YY_CURRENT_BUFFER_LVALUE->yy_ch_buf;
	char *source = (yytext_ptr);
	int number_to_move, i;
	int ret_val;

	if ( (yy_c_buf_p) > &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars) + 1] )
		YY_FATAL_ERROR(
		"fatal flex scanner internal error--end of buffer missed" );

	if ( YY_CURRENT_BUFFER_LVALUE->yy_fill_buffer == 0 )
		{ /* Don't try to fill the buffer, so this is an EOF. */
		if ( (yy_c_buf_p) - (yytext_ptr) - YY_MORE_ADJ == 1 )
			{
			/* We matched a single character, the EOB, so
			 * treat this as a final EOF.
			 */
			return EOB_ACT_END_OF_FILE;
			}

		else
			{
			/* We matched some text prior to the EOB, first
			 * process it.
			 */
			return EOB_ACT_LAST_MATCH;
			}
		}

	/* Try to read more data. */

	/* First move last chars to start of buffer. */
	number_to_move = (int) ((yy_c_buf_p) - (yytext_ptr) - 1);

	for ( i = 0; i < number_to_move; ++i )
		*(dest++) = *(source++);

	if ( YY_CURRENT_BUFFER_LVALUE->yy_buffer_status == YY_BUFFER_EOF_PENDING )
		/* don't do the read, it's not guaranteed to return an EOF,
		 * just force an EOF
		 */
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars) = 0;

	else
		{
			int num_to_read =
			YY_CURRENT_BUFFER_LVALUE->yy_buf_size - number_to_move - 1;

		while ( num_to_read <= 0 )
			{ /* Not enough room in the buffer - grow it. */

			/* just a shorter name for the current buffer */
			YY_BUFFER_STATE b = YY_CURRENT_BUFFER_LVALUE;

			int yy_c_buf_p_offset =
				(int) ((yy_c_buf_p) - b->yy_ch_buf);

			if ( b->yy_is_our_buffer )
				{
				int new_size = b->yy_buf_size * 2;

				if ( new_size <= 0 )
					b->yy_buf_size += b->yy_buf_size / 8;
				else
					b->yy_buf_size *= 2;

				b->yy_ch_buf = (char *)
					/* Include room in for 2 EOB chars. */
					yyrealloc( (void *) b->yy_ch_buf,
							 (yy_size_t) (b->yy_buf_size + 2)  );
				}
			else
				/* Can't grow it, we don't own it. */
				b->yy_ch_buf = NULL;

			if ( ! b->yy_ch_buf )
				YY_FATAL_ERROR(
				"fatal error - scanner input buffer overflow" );

			(yy_c_buf_p) = &b->yy_ch_buf[yy_c_buf_p_offset];

			num_to_read = YY_CURRENT_BUFFER_LVALUE->yy_buf_size -
						number_to_move - 1;

			}

		if ( num_to_read > YY_READ_BUF_SIZE )
			num_to_read = YY_READ_BUF_SIZE;

		/* Read in more data. */
		YY_INPUT( (&YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[number_to_move]),
			(yy_n_chars), num_to_read );

		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars);
		}

	if ( (yy_n_chars) == 0 )
		{
		if ( number_to_move == YY_MORE_ADJ )
			{
			ret_val = EOB_ACT_END_OF_FILE;
			yyrestart( yyin  );
			}

		else
			{
			ret_val = EOB_ACT_LAST_MATCH;
			YY_CURRENT_BUFFER_LVALUE->yy_buffer_status =
				YY_BUFFER_EOF_PENDING;
			}
		}

	else
		ret_val = EOB_ACT_CONTINUE_SCAN;

	if (((yy_n_chars) + number_to_move) > YY_CURRENT_BUFFER_LVALUE->yy_buf_size) {
		/* Extend the array by 50%, plus the number we really need. */
		int new_size = (yy_n_chars) + number_to_move + ((yy_n_chars) >> 1);
		YY_CURRENT_BUFFER_LVALUE->yy_ch_buf = (char *) yyrealloc(
			(void *) YY_CURRENT_BUFFER_LVALUE->yy_ch_buf, (yy_size_t) new_size  );
		if ( ! YY_CURRENT_BUFFER_LVALUE->yy_ch_buf )
			YY_FATAL_ERROR( "out of dynamic memory in yy_get_next_buffer()" );
		/* "- 2" to take care of EOB's */
		YY_CURRENT_BUFFER_LVALUE->yy_buf_size = (int) (new_size - 2);
	}

	(yy_n_chars) += number_to_move;
	YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars)] = YY_END_OF_BUFFER_CHAR;
	YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars) + 1] = YY_END_OF_BUFFER_CHAR;

	(yytext_ptr) = &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[0];

	return ret_val;
}